

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TweakableParser.cpp
# Opt level: O0

Pair<Corrade::Utility::TweakableState,_bool> __thiscall
Corrade::Utility::TweakableParser<bool>::parse(TweakableParser<bool> *this,StringView value)

{
  StringView value_00;
  StringView a;
  StringView a_00;
  bool bVar1;
  Debug *pDVar2;
  bool local_ca;
  TweakableState local_c9;
  TweakableParser<bool> *local_c8;
  char *pcStack_c0;
  Flags local_99;
  Warning local_98;
  bool local_6a;
  TweakableState local_69;
  StringView local_68;
  TweakableParser<bool> *local_58;
  char *local_50;
  bool local_42;
  TweakableState local_41;
  StringView local_40;
  TweakableParser<bool> *local_30;
  char *local_28;
  TweakableParser<bool> *pTStack_20;
  StringView value_local;
  
  local_28 = value._data;
  local_30 = this;
  pTStack_20 = this;
  value_local._data = local_28;
  local_40 = Containers::Literals::StringLiterals::operator____s("true",4);
  a_00._sizePlusFlags = (size_t)local_28;
  a_00._data = (char *)local_30;
  bVar1 = Containers::operator==(a_00,local_40);
  if (bVar1) {
    local_41 = Success;
    local_42 = true;
    Containers::Pair<Corrade::Utility::TweakableState,_bool>::Pair
              ((Pair<Corrade::Utility::TweakableState,_bool> *)
               ((long)&value_local._sizePlusFlags + 6),&local_41,&local_42);
  }
  else {
    local_58 = pTStack_20;
    local_50 = value_local._data;
    local_68 = Containers::Literals::StringLiterals::operator____s("false",5);
    a._sizePlusFlags = (size_t)local_50;
    a._data = (char *)local_58;
    bVar1 = Containers::operator==(a,local_68);
    if (bVar1) {
      local_69 = Success;
      local_6a = false;
      Containers::Pair<Corrade::Utility::TweakableState,_bool>::Pair
                ((Pair<Corrade::Utility::TweakableState,_bool> *)
                 ((long)&value_local._sizePlusFlags + 6),&local_69,&local_6a);
    }
    else {
      Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_99);
      Warning::Warning(&local_98,local_99);
      pDVar2 = Debug::operator<<(&local_98.super_Debug,"Utility::TweakableParser:");
      local_c8 = pTStack_20;
      pcStack_c0 = value_local._data;
      value_00._sizePlusFlags = (size_t)value_local._data;
      value_00._data = (char *)pTStack_20;
      pDVar2 = Debug::operator<<(pDVar2,value_00);
      Debug::operator<<(pDVar2,"is not a boolean literal");
      Warning::~Warning(&local_98);
      local_c9 = Recompile;
      local_ca = false;
      Containers::Pair<Corrade::Utility::TweakableState,_bool>::Pair
                ((Pair<Corrade::Utility::TweakableState,_bool> *)
                 ((long)&value_local._sizePlusFlags + 6),&local_c9,&local_ca);
    }
  }
  return value_local._sizePlusFlags._6_2_;
}

Assistant:

Containers::Pair<TweakableState, bool> TweakableParser<bool>::parse(Containers::StringView value) {
    using namespace Containers::Literals;

    if(value == "true"_s)
        return {TweakableState::Success, true};
    if(value == "false"_s)
        return {TweakableState::Success, false};

    Warning{} << "Utility::TweakableParser:" << value << "is not a boolean literal";
    return {TweakableState::Recompile, {}};
}